

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
     grow(buffer<unsigned_int> *buf,size_t size)

{
  uint *puVar1;
  size_t sVar2;
  uint *puVar3;
  buffer<unsigned_int> *p;
  size_t sVar4;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *self;
  size_t size_local;
  buffer<unsigned_int> *buf_local;
  
  detail::abort_fuzzing_if(5000 < size);
  puVar1 = (uint *)std::allocator_traits<fmt::v11::detail::allocator<unsigned_int>_>::max_size
                             ((allocator<unsigned_int> *)(buf + 5));
  sVar2 = detail::buffer<unsigned_int>::capacity(buf);
  puVar3 = (uint *)(sVar2 + (sVar2 >> 1));
  old_data = (uint *)size;
  if ((size <= puVar3) && (old_data = puVar3, puVar1 < puVar3)) {
    old_data = (uint *)max_of<unsigned_long>(size,(unsigned_long)puVar1);
  }
  p = (buffer<unsigned_int> *)detail::buffer<unsigned_int>::data(buf);
  puVar1 = detail::allocator<unsigned_int>::allocate
                     ((allocator<unsigned_int> *)(buf + 5),(size_t)old_data);
  detail::buffer<unsigned_int>::size(buf);
  sVar4 = detail::buffer<unsigned_int>::size(buf);
  memcpy(puVar1,p,sVar4 << 2);
  detail::buffer<unsigned_int>::set(buf,puVar1,(size_t)old_data);
  if (p != buf + 1) {
    detail::allocator<unsigned_int>::deallocate
              ((allocator<unsigned_int> *)(buf + 5),(uint *)p,sVar2);
  }
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }